

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_iarchive.h
# Opt level: O1

void __thiscall serialization::xml_iarchive::load_key_start(xml_iarchive *this,char *key)

{
  iterator *piVar1;
  _Elt_pointer ppxVar2;
  undefined8 *puVar3;
  xml_node<char> *node;
  xml_node<char> *local_18;
  
  ppxVar2 = (this->stack_).c.
            super__Deque_base<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppxVar2 ==
      (this->stack_).c.
      super__Deque_base<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    ppxVar2 = (this->stack_).c.
              super__Deque_base<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  local_18 = rapidxml::xml_node<char>::first_node(ppxVar2[-1],key,0,true);
  if (local_18 != (xml_node<char> *)0x0) {
    ppxVar2 = (this->stack_).c.
              super__Deque_base<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppxVar2 ==
        (this->stack_).c.
        super__Deque_base<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
      std::deque<rapidxml::xml_node<char>const*,std::allocator<rapidxml::xml_node<char>const*>>::
      _M_push_back_aux<rapidxml::xml_node<char>const*const&>
                ((deque<rapidxml::xml_node<char>const*,std::allocator<rapidxml::xml_node<char>const*>>
                  *)&this->stack_,&local_18);
    }
    else {
      *ppxVar2 = local_18;
      piVar1 = &(this->stack_).c.
                super__Deque_base<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>
                ._M_impl.super__Deque_impl_data._M_finish;
      piVar1->_M_cur = piVar1->_M_cur + 1;
    }
    return;
  }
  puVar3 = (undefined8 *)__cxa_allocate_exception(0x18);
  *puVar3 = &PTR__exception_00120d50;
  puVar3[1] = key;
  puVar3[2] = "expect key";
  __cxa_throw(puVar3,&serialization_error::typeinfo,std::exception::~exception);
}

Assistant:

void load_key_start(const char * key) const
    {
        serialization_trace trace(__func__, key);

        auto node = stack_.top()->first_node(key);
        if(node == nullptr)
            throw_serialization_error("expect key", key);
        stack_.push(node);
    }